

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unwind.c
# Opt level: O0

LispPTR * N_OP_unwind(LispPTR *cstkptr,LispPTR tos,int n,int keep)

{
  uint uVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  DLword *local_38;
  LispPTR *lastpvar;
  LispPTR *endptr;
  int num;
  int keep_local;
  int n_local;
  LispPTR tos_local;
  LispPTR *cstkptr_local;
  
  pLVar2 = (LispPTR *)(MachineState.pvar + (long)n * 2);
  if (cstkptr < pLVar2) {
    MachineState.errorexit = 1;
    cstkptr_local = (LispPTR *)0xffffffffffffffff;
    MachineState.csp = (DLword *)cstkptr;
    MachineState.tosvalue = tos;
  }
  else {
    *cstkptr = tos;
    _n_local = cstkptr + 1;
    while (pLVar2 < _n_local) {
      pLVar3 = _n_local + -1;
      uVar1 = _n_local[-1];
      _n_local = pLVar3;
      if ((int)uVar1 < 0) {
        endptr._0_4_ = ((int)uVar1 >> 0x10 ^ 0xffffffffU) + 1;
        local_38 = MachineState.pvar + (long)(int)(uVar1 & 0xffff) + 2;
        while (endptr._0_4_ = (int)endptr + -1, 0 < (int)endptr) {
          local_38[-2] = 0xffff;
          local_38[-1] = 0xffff;
          local_38 = local_38 + -2;
        }
      }
    }
    if (keep != 0) {
      *_n_local = tos;
      _n_local = _n_local + 1;
    }
    cstkptr_local = _n_local;
  }
  return cstkptr_local;
}

Assistant:

LispPTR *N_OP_unwind(LispPTR *cstkptr, LispPTR tos, int n, int keep) {
  int num;           /* number of UNBOUND slot */
  LispPTR *endptr;   /* unwind limit */
  LispPTR *lastpvar; /* points PVar slot that is unbounded. */

  /* Slots:
          -----------------
          |		|	<- PVar
          -----------------
          |	.	|
          |	.	|
          -----------------
          |		|	 ALL OF THE FOLLOWING LOCATIONS SCANNED:
          -----------------------------------------------------------------
          | tos if keep	|	<- endptr (PVar[n]) <- Result (no keep)	|
          -----------------						|
          |		|	<- Result (keep)			|
          -----------------						|
          |		|						|
          -----------------						|
          |	.	|						|
          |	.	|						|
          -----------------						|
          |   tos pushed	|	<- Start CSTKPTR			|
          -----------------------------------------------------------------
          |		|	<- CSTKPTR temporarily bumped pushing tos
          -----------------

          NOTE: upon return the emulator does a POP to get the new tos value

  */

  endptr = (LispPTR *)PVar + n; /* set unwind limit */

  if (endptr > cstkptr) {
    CurrentStackPTR = (DLword *)cstkptr;
    /* this would be ERROR_EXIT(tos); but for having to return a pointer */
    TopOfStack = tos;
    Error_Exit = 1;
    return (LispPTR *)(-1);
  }
  *cstkptr++ = tos;

  /* UNBOUND MARK loop  */

  while (cstkptr > endptr) {
    /* Look for the Next BIND marker */

    if ((num = (int)*--cstkptr) < 0) {
      /* Now UNBIND the PVARS indicated by the BIND marker */

      lastpvar = (LispPTR *)(2 + PVar + (unsigned short)num);
      num = ~(num >> 16) + 1;
      for (; --num > 0;) { *--lastpvar = 0xffffffff; /* Mark as UNBOUND */ }
    }
  }

  /* endptr = cstkptr */

  if (keep) { *(cstkptr++) = tos; }
  return (cstkptr);

}